

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

_Bool sx_hashtbl_grow(sx_hashtbl **ptbl,sx_alloc *alloc)

{
  int iVar1;
  sx_hashtbl *psVar2;
  sx_hashtbl *tbl;
  long lVar3;
  
  psVar2 = *ptbl;
  tbl = sx_hashtbl_create(alloc,psVar2->capacity * 2);
  if (tbl != (sx_hashtbl *)0x0) {
    iVar1 = psVar2->capacity;
    if (0 < (long)iVar1) {
      lVar3 = 0;
      do {
        if (psVar2->keys[lVar3] != 0) {
          sx_hashtbl_add(tbl,psVar2->keys[lVar3],psVar2->values[lVar3]);
        }
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
    if (psVar2 != (sx_hashtbl *)0x0) {
      psVar2->count = 0;
      psVar2->capacity = 0;
      (*alloc->alloc_cb)(psVar2,0,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
    }
    *ptbl = tbl;
  }
  return tbl != (sx_hashtbl *)0x0;
}

Assistant:

bool sx_hashtbl_grow(sx_hashtbl** ptbl, const sx_alloc* alloc)
{
    sx_hashtbl* tbl = *ptbl;
    // Create a new table (double the size), repopulate it and replace previous one
    sx_hashtbl* new_tbl = sx_hashtbl_create(alloc, tbl->capacity << 1);
    if (!new_tbl)
        return false;

    for (int i = 0, c = tbl->capacity; i < c; i++) {
        if (tbl->keys[i] > 0)
            sx_hashtbl_add(new_tbl, tbl->keys[i], tbl->values[i]);
    }

    sx_hashtbl_destroy(tbl, alloc);
    *ptbl = new_tbl;
    return true;
}